

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

void __thiscall
adios2::query::QueryBase::ApplyOutputRegion
          (QueryBase *this,
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *touchedBlocks,Box<Dims> *referenceRegion)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer ppVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  pointer ppVar9;
  long lVar10;
  unsigned_long uVar11;
  Dims diff;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  lVar8 = (long)(this->m_OutputRegion).first.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_OutputRegion).first.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_38,lVar8 >> 3);
    puVar2 = (this->m_OutputRegion).first.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->m_OutputRegion).first.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = (long)puVar3 - (long)puVar2;
    if (lVar8 != 0) {
      lVar8 = lVar8 >> 3;
      puVar4 = (referenceRegion->first).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      bVar7 = 0;
      do {
        bVar6 = bVar7;
        uVar11 = puVar2[lVar10] - puVar4[lVar10];
        local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar10] = uVar11;
        lVar10 = lVar10 + 1;
        bVar7 = bVar6 | uVar11 != 0;
      } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
      if ((bool)(bVar6 | uVar11 != 0)) {
        ppVar9 = (touchedBlocks->
                 super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (touchedBlocks->
                 super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar9 != ppVar5) {
          do {
            if (puVar3 != puVar2) {
              puVar4 = (ppVar9->first).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar10 = 0;
              do {
                puVar1 = puVar4 + lVar10;
                *puVar1 = *puVar1 + local_38.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
            }
            ppVar9 = ppVar9 + 1;
          } while (ppVar9 != ppVar5);
        }
      }
    }
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void QueryBase::ApplyOutputRegion(std::vector<Box<Dims>> &touchedBlocks,
                                  const adios2::Box<Dims> &referenceRegion)
{
    if (m_OutputRegion.first.size() == 0)
        return;

    adios2::Dims diff;
    diff.resize(m_OutputRegion.first.size());
    bool isDifferent = false;
    for (size_t k = 0; k < m_OutputRegion.first.size(); k++)
    {
        diff[k] = m_OutputRegion.first[k] - referenceRegion.first[k];
        if (diff[k] != 0)
            isDifferent = true;
    }

    if (!isDifferent)
        return;

    // blocks are usually part of the reference region
    for (auto it = touchedBlocks.begin(); it != touchedBlocks.end(); it++)
    {
        for (size_t k = 0; k < m_OutputRegion.first.size(); k++)
            it->first[k] += diff[k];
    }
}